

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O0

double __thiscall logger::log(logger *this,double __x)

{
  char *pcVar1;
  char *pcVar2;
  uint64_t uVar3;
  ostream *poVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  int in_ESI;
  double extraout_XMM0_Qa;
  double dVar5;
  uint64_t ts;
  string *msg_local;
  int level_local;
  logger *this_local;
  
  pcVar1 = levels[in_ESI];
  pcVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::c_str
                     (in_RDX);
  syslog(in_ESI,"[%s] %s",pcVar1,pcVar2);
  dVar5 = extraout_XMM0_Qa;
  if (in_ESI <= this->ll) {
    uVar3 = timestamp();
    poVar4 = (ostream *)std::ostream::operator<<(&std::cerr,uVar3 / 1000);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,uVar3 % 1000);
    poVar4 = std::operator<<(poVar4," [");
    poVar4 = std::operator<<(poVar4,levels[in_ESI]);
    poVar4 = std::operator<<(poVar4,"]");
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = std::operator<<(poVar4,(string *)in_RDX);
    dVar5 = (double)std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  return dVar5;
}

Assistant:

void logger::log(int level, std::string const & msg) {
    syslog(level, "[%s] %s", levels[level], msg.c_str());
    if (level <= ll) {
        auto ts = timestamp();
        std::cerr << ts / 1000 << "." << ts % 1000 << " [" << levels[level] << "]" << " " << msg << std::endl;
    }
}